

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astr.c
# Opt level: O3

void print_escaped_astr(FILE *out,astr *astr)

{
  byte bVar1;
  char *__ptr;
  ulong uVar2;
  
  fputc(0x22,(FILE *)out);
  if (astr->len != 0) {
    uVar2 = 0;
    do {
      bVar1 = astr->str[uVar2];
      switch(bVar1) {
      case 7:
        __ptr = "\\a";
        break;
      case 8:
switchD_0026c7cc_caseD_8:
        if ((byte)(bVar1 - 0x20) < 0x5f) {
          fputc((uint)bVar1,(FILE *)out);
        }
        else {
          fprintf((FILE *)out,"\\x%02x");
        }
        goto LAB_0026c88c;
      case 9:
        __ptr = "\\t";
        break;
      case 10:
        __ptr = "\\n";
        break;
      case 0xb:
        __ptr = "\\v";
        break;
      case 0xc:
        __ptr = "\\f";
        break;
      case 0xd:
        __ptr = "\\r";
        break;
      default:
        if (bVar1 == 0x22) {
          __ptr = "\\\"";
        }
        else {
          if (bVar1 != 0x5c) goto switchD_0026c7cc_caseD_8;
          __ptr = "\\\\";
        }
      }
      fwrite(__ptr,2,1,(FILE *)out);
LAB_0026c88c:
      uVar2 = uVar2 + 1;
    } while (uVar2 < astr->len);
  }
  fputc(0x22,(FILE *)out);
  return;
}

Assistant:

void print_escaped_astr(FILE *out, struct astr *astr) {
	int i;
	fprintf(out, "\"");
	for (i = 0; i < astr->len; i++) {
		unsigned char c = astr->str[i];
		switch (c) {
			case '\\':
				fprintf(out, "\\\\");
				break;
			case '\"':
				fprintf(out, "\\\"");
				break;
			case '\n':
				fprintf(out, "\\n");
				break;
			case '\f':
				fprintf(out, "\\f");
				break;
			case '\t':
				fprintf(out, "\\t");
				break;
			case '\a':
				fprintf(out, "\\a");
				break;
			case '\v':
				fprintf(out, "\\v");
				break;
			case '\r':
				fprintf(out, "\\r");
				break;
			default:
				if (c >= 0x20 && c <= 0x7e) {
					fprintf(out, "%c", c);
				} else {
					fprintf(out, "\\x%02x", c);
				}
				break;
		}
	}
	fprintf(out, "\"");
}